

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O3

void __thiscall Selector::fillPollFds(Selector *this,pollfd *fds,int *numFds)

{
  Node *pNVar1;
  ListenerNode *pLVar2;
  uint uVar3;
  Node *pNVar4;
  ulong uVar5;
  AutoLock m;
  AutoLock local_30;
  
  AutoLock::AutoLock(&local_30,&this->mLock);
  fds->fd = this->mPipe[0];
  fds->events = 1;
  pNVar1 = (this->mList).mTail;
  pNVar4 = ((this->mList).mHead)->next;
  uVar3 = 1;
LAB_0011e049:
  do {
    if (pNVar4 == pNVar1) {
LAB_0011e0b7:
      *numFds = uVar3;
      AutoLock::~AutoLock(&local_30);
      return;
    }
    uVar5 = 1;
    if ((int)uVar3 < 2) {
LAB_0011e080:
      if ((uint)uVar5 == uVar3) goto LAB_0011e084;
      if (pNVar4 == (Node *)0x0) {
        pNVar4 = (Node *)0x0;
        goto LAB_0011e049;
      }
    }
    else {
      uVar5 = 1;
      do {
        if (fds[uVar5].fd == pNVar4->val->mFd) {
          fds[uVar5].events = fds[uVar5].events & pNVar4->val->mEvents;
          goto LAB_0011e080;
        }
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_0011e084:
      pLVar2 = pNVar4->val;
      fds[(int)uVar3].fd = pLVar2->mFd;
      fds[(int)uVar3].events = pLVar2->mEvents;
      uVar3 = uVar3 + 1;
      if (uVar3 == 0x40) {
        uVar3 = 0x40;
        goto LAB_0011e0b7;
      }
    }
    pNVar4 = pNVar4->next;
  } while( true );
}

Assistant:

void Selector::fillPollFds( struct pollfd *fds, int &numFds )
{
	AutoLock m( mLock );
	TRACE_BEGIN( LOG_LVL_INFO );

	fds[ 0 ].fd = mPipe[ PIPE_READER ];
	fds[ 0 ].events = POLLIN;

	int j, i = 1;

	for (JetHead::list<ListenerNode*>::iterator listener = mList.begin(); 
		 listener != mList.end(); ++listener)
	{
		// If we already have this fd in our list, skip it
		for ( j = 1; j < i; j++ )
		{
			if ( fds[ j ].fd == (*listener)->mFd )
			{
				fds[ j ].events &= (*listener)->mEvents;
				break;
			}
		}
		
		if ( j == i )
		{
			fds[ i ].fd = (*listener)->mFd;
			fds[ i ].events = (*listener)->mEvents;
			i++;

			if ( i == kMaxPollFds )
			{
				numFds = kMaxPollFds;
				return;
			}
		}
	}
	
	numFds = i;
	
	for ( i = 0; i < numFds; i++ )
	{
		LOG_NOISE( "file entry %d: fd %d events %x", i, fds[ i ].fd, fds[ i ].events );
	}
	
	LOG( "poll on %d fds, size %d", numFds, mList.size() );
}